

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O0

bool NumberTemp::IsTempProducing(Instr *instr)

{
  bool bVar1;
  ObjectType OVar2;
  Opnd *this;
  IndirOpnd *this_00;
  RegOpnd *this_01;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1c;
  OpCode local_1a;
  ValueType baseValueType;
  Instr *pIStack_18;
  OpCode opcode;
  Instr *instr_local;
  
  local_1a = instr->m_opcode;
  pIStack_18 = instr;
  bVar1 = OpCodeAttr::TempNumberProducing(local_1a);
  if (bVar1) {
    instr_local._7_1_ = true;
  }
  else {
    if (local_1a == LdElemI_A) {
      this = IR::Instr::GetSrc1(pIStack_18);
      this_00 = IR::Opnd::AsIndirOpnd(this);
      this_01 = IR::IndirOpnd::GetBaseOpnd(this_00);
      local_1c.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(&this_01->super_Opnd);
      bVar1 = ValueType::IsLikelyObject((ValueType *)&local_1c.field_0);
      if ((bVar1) &&
         ((OVar2 = ValueType::GetObjectType((ValueType *)&local_1c.field_0), OVar2 == Float32Array
          || (OVar2 = ValueType::GetObjectType((ValueType *)&local_1c.field_0),
             OVar2 == Float64Array)))) {
        return true;
      }
    }
    instr_local._7_1_ = false;
  }
  return instr_local._7_1_;
}

Assistant:

bool
NumberTemp::IsTempProducing(IR::Instr * instr)
{
    Js::OpCode opcode = instr->m_opcode;
    if (OpCodeAttr::TempNumberProducing(opcode))
    {
        return true;
    }

    // Loads from float typedArrays usually require a conversion to Var, which we can MarkTemp.
    if (opcode == Js::OpCode::LdElemI_A)
    {
        const ValueType baseValueType(instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetValueType());
        if (baseValueType.IsLikelyObject()
            && (baseValueType.GetObjectType() == ObjectType::Float32Array
            || baseValueType.GetObjectType() == ObjectType::Float64Array))
        {
            return true;
        }
    }

    return false;
}